

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O1

string * __thiscall
Kernel::OperatorType::argsToString_abi_cxx11_(string *__return_storage_ptr__,OperatorType *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  string local_58;
  TermList local_38;
  
  uVar2 = this->_typeArgsArity;
  iVar6 = *(int *)this->_key;
  uVar5 = (uVar2 + iVar6) - 1;
  pcVar4 = "(";
  if (uVar5 < 2) {
    pcVar4 = "";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (uVar5 >= 2));
  uVar3 = this->_typeArgsArity;
  if (uVar3 < uVar5) {
    iVar6 = -(uVar2 + iVar6);
    do {
      if (uVar3 < this->_typeArgsArity) {
        local_38 = AtomicSort::superSort();
      }
      else {
        local_38._content =
             *(uint64_t *)(this->_key + (ulong)(uVar3 - this->_typeArgsArity) * 8 + 8);
      }
      TermList::toString_abi_cxx11_(&local_58,&local_38,false);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (iVar6 + uVar3 != -2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar1 = iVar6 + uVar3;
      uVar3 = uVar3 + 1;
    } while (iVar1 != -2);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string OperatorType::argsToString() const
{
  unsigned ar = arity();
  ASS(ar);
  std::string res = ar > 1 ? "(" : "";
  for (unsigned i = _typeArgsArity; i < ar; i++) {
    res += arg(i).toString();
    if (i != ar-1) {
      res += " * ";
    }
  }
  res += ar > 1 ? ")" : "";
  return res;
}